

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenTableSetSetIndex(BinaryenExpressionRef expr,BinaryenExpressionRef indexExpr)

{
  if (expr->_id != TableSetId) {
    __assert_fail("expression->is<TableSet>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x9f3,
                  "void BinaryenTableSetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (indexExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = indexExpr;
    return;
  }
  __assert_fail("indexExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x9f4,"void BinaryenTableSetSetIndex(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenTableSetSetIndex(BinaryenExpressionRef expr,
                              BinaryenExpressionRef indexExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableSet>());
  assert(indexExpr);
  static_cast<TableSet*>(expression)->index = (Expression*)indexExpr;
}